

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O2

int Abc_NtkMfsSolveSatResub
              (Mfs_Man_t *p,Abc_Obj_t *pNode,int iFanin,int fOnlyRemove,int fSkipUpdate)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Ptr_t *p_00;
  uint uVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  Hop_Obj_t *pHVar9;
  abctime aVar10;
  Abc_Obj_t *pAVar11;
  void *pvVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int i;
  ulong uVar19;
  ulong uVar20;
  float fVar21;
  int pCands [12];
  
  if (iFanin < 0) {
    __assert_fail("iFanin >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsResub.c"
                  ,0xae,"int Abc_NtkMfsSolveSatResub(Mfs_Man_t *, Abc_Obj_t *, int, int, int)");
  }
  uVar20 = (ulong)(uint)iFanin;
  p->nTryRemoves = p->nTryRemoves + 1;
  Vec_PtrFillSimInfo(p->vDivCexes,p->nDivWords,iFanin);
  p->nCexes = 0;
  if (p->pPars->fVeryVerbose != 0) {
    uVar13 = pNode->Id;
    uVar1 = *(uint *)&pNode->field_0x14;
    uVar2 = p->vSupp->nSize;
    uVar3 = p->vNodes->nSize;
    iVar18 = p->vDivs->nSize;
    uVar4 = (pNode->vFanins).nSize;
    lVar17 = (long)(pNode->vFanins).pArray[uVar20];
    pAVar11 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[lVar17];
    uVar16 = 0;
    if ((pAVar11->vFanouts).nSize == 1) {
      uVar5 = Abc_NodeMffcLabel(pAVar11);
      uVar16 = (ulong)uVar5;
    }
    printf("%5d : Lev =%3d. Leaf =%3d. Node =%3d. Divs =%3d.  Fanin = %4d (%d/%d), MFFC = %d\n",
           (ulong)uVar13,(ulong)(uVar1 >> 0xc),(ulong)uVar2,(ulong)uVar3,(ulong)(iVar18 - uVar4),
           lVar17,uVar20,(ulong)uVar4,uVar16);
  }
  p->vMfsFanins->nSize = 0;
  iVar18 = 0;
  for (uVar16 = 0; (long)uVar16 < (long)(pNode->vFanins).nSize; uVar16 = uVar16 + 1) {
    if (uVar20 != uVar16) {
      Vec_PtrPush(p->vMfsFanins,pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar16]]);
      iVar6 = Vec_IntEntry(p->vProjVarsSat,(p->vDivs->nSize - (pNode->vFanins).nSize) + (int)uVar16)
      ;
      pCands[iVar18] = iVar6 * 2 + 1;
      iVar18 = iVar18 + 1;
    }
  }
  iVar7 = Abc_NtkMfsTryResubOnce(p,pCands,iVar18);
  iVar6 = 0;
  if (iVar7 != -1) {
    if (iVar7 == 1) {
      if (p->pPars->fVeryVerbose != 0) {
        printf("Node %d: Fanin %d can be removed.\n",(ulong)(uint)pNode->Id,uVar20);
      }
      p->nNodesResub = p->nNodesResub + 1;
      p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
      if (fSkipUpdate == 0) {
        aVar8 = Abc_Clock();
        pHVar9 = Abc_NtkMfsInterplate(p,pCands,iVar18);
        if (pHVar9 == (Hop_Obj_t *)0x0) {
          return 0;
        }
        Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar9);
        aVar10 = Abc_Clock();
        p->timeInt = p->timeInt + (aVar10 - aVar8);
        p->nRemoves = p->nRemoves + 1;
      }
      iVar6 = 1;
    }
    else {
      iVar6 = 0;
      if ((fOnlyRemove == 0) && (p->pPars->fRrOnly == 0)) {
        p->nTryResubs = p->nTryResubs + 1;
        uVar13 = p->nCexes;
        do {
          uVar13 = (((int)uVar13 >> 5) + 1) - (uint)((uVar13 & 0x1f) == 0);
          if (p->nDivWords < (int)uVar13) {
            __assert_fail("nWords <= p->nDivWords",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsResub.c"
                          ,0x100,
                          "int Abc_NtkMfsSolveSatResub(Mfs_Man_t *, Abc_Obj_t *, int, int, int)");
          }
          uVar19 = 0;
          uVar16 = 0;
          if (0 < (int)uVar13) {
            uVar16 = (ulong)uVar13;
          }
          while( true ) {
            iVar7 = p->vDivs->nSize - (pNode->vFanins).nSize;
            i = (int)uVar19;
            if (iVar7 <= i) break;
            if (p->pPars->fPower == 0) {
LAB_003b35f6:
              pvVar12 = Vec_PtrEntry(p->vDivCexes,i);
              for (uVar14 = 0;
                  (uVar15 = uVar16, uVar16 != uVar14 &&
                  (uVar15 = uVar14, *(int *)((long)pvVar12 + uVar14 * 4) == -1));
                  uVar14 = uVar14 + 1) {
              }
              if ((uint)uVar15 == uVar13) {
                iVar7 = p->vDivs->nSize - (pNode->vFanins).nSize;
                break;
              }
            }
            else {
              pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs,i);
              fVar21 = Abc_MfsObjProb(p,pAVar11);
              if (fVar21 < 0.15) goto LAB_003b35f6;
            }
            uVar19 = (ulong)(i + 1);
          }
          iVar6 = 0;
          if (i == iVar7) {
            return 0;
          }
          iVar7 = Vec_IntEntry(p->vProjVarsSat,i);
          pCands[iVar18] = iVar7 * 2 + 1;
          iVar7 = Abc_NtkMfsTryResubOnce(p,pCands,iVar18 + 1);
          if (iVar7 == -1) {
            return 0;
          }
          if (iVar7 == 1) {
            if (p->pPars->fVeryVerbose != 0) {
              printf("Node %d: Fanin %d can be replaced by divisor %d.\n",(ulong)(uint)pNode->Id,
                     uVar20,uVar19);
            }
            p->nNodesResub = p->nNodesResub + 1;
            p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
            if (fSkipUpdate == 0) {
              aVar8 = Abc_Clock();
              pHVar9 = Abc_NtkMfsInterplate(p,pCands,iVar18 + 1);
              if (pHVar9 == (Hop_Obj_t *)0x0) {
                return 0;
              }
              p_00 = p->vMfsFanins;
              pvVar12 = Vec_PtrEntry(p->vDivs,i);
              Vec_PtrPush(p_00,pvVar12);
              Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar9);
              aVar10 = Abc_Clock();
              p->timeInt = p->timeInt + (aVar10 - aVar8);
              p->nResubs = p->nResubs + 1;
            }
            return 1;
          }
          uVar13 = p->nCexes;
        } while ((int)uVar13 < p->pPars->nWinMax);
        if (p->pPars->fVeryVerbose != 0) {
          iVar6 = 0;
          printf("Node %d: Cannot find replacement for fanin %d.\n",(ulong)(uint)pNode->Id,uVar20);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int Abc_NtkMfsSolveSatResub( Mfs_Man_t * p, Abc_Obj_t * pNode, int iFanin, int fOnlyRemove, int fSkipUpdate )
{
    int fVeryVerbose = 0;//p->pPars->fVeryVerbose && Vec_PtrSize(p->vDivs) < 200;// || pNode->Id == 556;
    unsigned * pData;
    int pCands[MFS_FANIN_MAX];
    int RetValue, iVar, i, nCands, nWords, w;
    abctime clk;
    Abc_Obj_t * pFanin;
    Hop_Obj_t * pFunc;
    assert( iFanin >= 0 );
    p->nTryRemoves++;

    // clean simulation info
    Vec_PtrFillSimInfo( p->vDivCexes, 0, p->nDivWords ); 
    p->nCexes = 0;
    if ( p->pPars->fVeryVerbose )
    {
//        printf( "\n" );
        printf( "%5d : Lev =%3d. Leaf =%3d. Node =%3d. Divs =%3d.  Fanin = %4d (%d/%d), MFFC = %d\n", 
            pNode->Id, pNode->Level, Vec_PtrSize(p->vSupp), Vec_PtrSize(p->vNodes), Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode), 
            Abc_ObjFaninId(pNode, iFanin), iFanin, Abc_ObjFaninNum(pNode), 
            Abc_ObjFanoutNum(Abc_ObjFanin(pNode, iFanin)) == 1 ? Abc_NodeMffcLabel(Abc_ObjFanin(pNode, iFanin)) : 0 );
    }

    // try fanins without the critical fanin
    nCands = 0;
    Vec_PtrClear( p->vMfsFanins );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( i == iFanin )
            continue;
        Vec_PtrPush( p->vMfsFanins, pFanin );
        iVar = Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode) + i;
        pCands[nCands++] = toLitCond( Vec_IntEntry( p->vProjVarsSat, iVar ), 1 );
    }
    RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands );
    if ( RetValue == -1 )
        return 0;
    if ( RetValue == 1 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Node %d: Fanin %d can be removed.\n", pNode->Id, iFanin );
        p->nNodesResub++;
        p->nNodesGainedLevel++;
        if ( fSkipUpdate )
            return 1;
clk = Abc_Clock();
        // derive the function
        pFunc = Abc_NtkMfsInterplate( p, pCands, nCands );
        if ( pFunc == NULL )
            return 0;
        // update the network
        Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
        p->nRemoves++;
        return 1;
    }

    if ( fOnlyRemove || p->pPars->fRrOnly )
        return 0;

    p->nTryResubs++;
    if ( fVeryVerbose )
    {
        for ( i = 0; i < 9; i++ )
            printf( " " );
        for ( i = 0; i < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); i++ )
            printf( "%d", i % 10 );
        for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
            if ( i == iFanin )
                printf( "*" );
            else
                printf( "%c", 'a' + i );
        printf( "\n" );
    }
    iVar = -1;
    while ( 1 ) 
    {
        if ( fVeryVerbose )
        {
            printf( "%3d: %3d ", p->nCexes, iVar );
            for ( i = 0; i < Vec_PtrSize(p->vDivs); i++ )
            {
                pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
                printf( "%d", Abc_InfoHasBit(pData, p->nCexes-1) );
            }
            printf( "\n" );
        }

        // find the next divisor to try
        nWords = Abc_BitWordNum(p->nCexes);
        assert( nWords <= p->nDivWords );
        for ( iVar = 0; iVar < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); iVar++ )
        {
            if ( p->pPars->fPower )
            {
                Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar);
                // only accept the divisor if it is "cool"
                if ( Abc_MfsObjProb(p, pDiv) >= 0.15 )
                    continue;
            }
            pData  = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar );
            for ( w = 0; w < nWords; w++ )
                if ( pData[w] != ~0 )
                    break;
            if ( w == nWords )
                break;
        }
        if ( iVar == Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode) )
            return 0;

        pCands[nCands] = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar), 1 );
        RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands+1 );
        if ( RetValue == -1 )
            return 0;
        if ( RetValue == 1 )
        {
            if ( p->pPars->fVeryVerbose )
                printf( "Node %d: Fanin %d can be replaced by divisor %d.\n", pNode->Id, iFanin, iVar );
            p->nNodesResub++;
            p->nNodesGainedLevel++;
            if ( fSkipUpdate )
                return 1;
clk = Abc_Clock();
            // derive the function
            pFunc = Abc_NtkMfsInterplate( p, pCands, nCands+1 );
            if ( pFunc == NULL )
                return 0;
            // update the network
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar) );
            Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
            p->nResubs++;
            return 1;
        }
        if ( p->nCexes >= p->pPars->nWinMax )
            break;
    }
    if ( p->pPars->fVeryVerbose )
        printf( "Node %d: Cannot find replacement for fanin %d.\n", pNode->Id, iFanin );
    return 0;
}